

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_parser.c
# Opt level: O3

char * flatcc_json_parser_union_vector
                 (flatcc_json_parser_t *ctx,char *buf,char *end,size_t union_index,
                 flatbuffers_voffset_t id,size_t handle,flatcc_json_parser_union_f *union_parser)

{
  void *pvVar1;
  char *pcVar2;
  
  pvVar1 = flatcc_builder_get_user_frame_ptr(ctx->ctx,handle);
  if (*(long *)((long)pvVar1 + union_index * 0x28 + 0x10) != 0) {
    if (ctx->error == 0) {
      ctx->error = 0x1c;
      ctx->pos = ((int)buf - *(int *)&ctx->line_start) + 1;
      ctx->error_loc = buf;
    }
    return end;
  }
  if (*(char *)((long)pvVar1 + union_index * 0x28 + 0x24) != '\0') {
    *(long *)((long)pvVar1 + 8) = *(long *)((long)pvVar1 + 8) + -1;
    pcVar2 = _parse_union_vector(ctx,buf,end,*(size_t *)((long)pvVar1 + union_index * 0x28 + 0x30),
                                 *(flatbuffers_uoffset_t *)
                                  ((long)pvVar1 + union_index * 0x28 + 0x28),id,union_parser);
    return pcVar2;
  }
  *(long *)((long)pvVar1 + 8) = *(long *)((long)pvVar1 + 8) + 1;
  *(int *)((long)pvVar1 + union_index * 0x28 + 0x20) = ctx->line;
  *(char **)((long)pvVar1 + union_index * 0x28 + 0x18) = ctx->line_start;
  *(char **)((long)pvVar1 + union_index * 0x28 + 0x10) = buf;
  pcVar2 = flatcc_json_parser_generic_json(ctx,buf,end);
  return pcVar2;
}

Assistant:

const char *flatcc_json_parser_union_vector(flatcc_json_parser_t *ctx,
        const char *buf, const char *end, size_t union_index,
        flatbuffers_voffset_t id, size_t handle, flatcc_json_parser_union_f *union_parser)
{
    __flatcc_json_parser_union_frame_t *f = flatcc_builder_get_user_frame_ptr(ctx->ctx, handle);
    __flatcc_json_parser_union_entry_t *e = f->unions + union_index;

    if (e->backtrace) {
        return flatcc_json_parser_set_error(ctx, buf, end, flatcc_json_parser_error_duplicate);
    }
    if (!e->type_present) {
        ++f->union_count;
        e->line = ctx->line;
        e->line_start = ctx->line_start;
        buf = flatcc_json_parser_generic_json(ctx, (e->backtrace = buf), end);
    } else {
        --f->union_count;
        buf = _parse_union_vector(ctx, buf, end, e->h_types, e->count, id, union_parser);
    }
    return buf;
}